

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t gnu_sparse_01_parse(archive_read *a,tar *tar,char *p,size_t length)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  wchar_t wVar4;
  int64_t size;
  char *pcVar5;
  int64_t remaining;
  long offset;
  
  offset = -1;
  do {
    pcVar5 = p;
    if (length == 0) {
      bVar3 = true;
      length = 0xffffffffffffffff;
    }
    else {
      pcVar1 = p + length;
      do {
        cVar2 = *pcVar5;
        bVar3 = cVar2 != ',';
        if (cVar2 == ',') goto LAB_001330f0;
        if ((byte)(cVar2 - 0x3aU) < 0xf6) {
          return L'\xffffffec';
        }
        pcVar5 = pcVar5 + 1;
        length = length - 1;
      } while (length != 0);
      length = 0;
      pcVar5 = pcVar1;
LAB_001330f0:
      length = length - 1;
    }
    remaining = tar_atol_base_n(p,(long)pcVar5 - (long)p,L'\n');
    if (offset < 0) {
      if (remaining < 0) {
        return L'\xffffffec';
      }
    }
    else {
      if (remaining < 0) {
        return L'\xffffffec';
      }
      wVar4 = gnu_add_sparse_entry(a,tar,offset,remaining);
      remaining = -1;
      if (wVar4 != L'\0') {
        return L'\xffffffe2';
      }
    }
    p = pcVar5 + 1;
    offset = remaining;
    if (bVar3) {
      return L'\0';
    }
  } while( true );
}

Assistant:

static int
gnu_sparse_01_parse(struct archive_read *a, struct tar *tar, const char *p, size_t length)
{
	const char *e;
	int64_t offset = -1, size = -1;

	for (;;) {
		e = p;
		while (length > 0 && *e != ',') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
			length--;
		}
		if (offset < 0) {
			offset = tar_atol10(p, e - p);
			if (offset < 0)
				return (ARCHIVE_WARN);
		} else {
			size = tar_atol10(p, e - p);
			if (size < 0)
				return (ARCHIVE_WARN);
			if (gnu_add_sparse_entry(a, tar, offset, size)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			offset = -1;
		}
		if (length == 0)
			return (ARCHIVE_OK);
		p = e + 1;
		length--;
	}
}